

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextProtocol.cpp
# Opt level: O1

void __thiscall mognetwork::protocol::TextProtocol::flushReader(TextProtocol *this)

{
  ReadedDatas *pRVar1;
  pointer pcVar2;
  ReadedDatas local_38;
  
  TcpSocket::ReadedDatas::ReadedDatas(&local_38);
  (this->super_AProtocolListener).m_pendingDatas.totalSize = local_38.totalSize;
  (this->super_AProtocolListener).m_pendingDatas.readed = local_38.readed;
  std::vector<char,_std::allocator<char>_>::operator=
            (&(this->super_AProtocolListener).m_pendingDatas.datas,&local_38.datas);
  if (local_38.datas.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_38.datas.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pRVar1 = this->m_fullDatas;
  if (pRVar1 != (ReadedDatas *)0x0) {
    pcVar2 = (pRVar1->datas).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pcVar2 != (pointer)0x0) {
      operator_delete(pcVar2);
    }
    operator_delete(pRVar1);
  }
  this->m_fullDatas = (ReadedDatas *)0x0;
  return;
}

Assistant:

void TextProtocol::flushReader()
    {
      m_pendingDatas = TcpSocket::ReadedDatas();
      if (m_fullDatas != NULL)
	delete m_fullDatas;
      m_fullDatas = NULL;
    }